

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> * __thiscall
Parser::parseFunctionDeclarationExpression
          (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<StatementAstNode> *__x;
  TokenType type;
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> local_300;
  undefined1 local_2e8 [8];
  optional<std::shared_ptr<StatementAstNode>_> statement;
  string local_2c8 [32];
  undefined1 local_2a8 [16];
  undefined1 local_298 [24];
  string local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [24];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  string local_220 [32];
  undefined1 local_200 [24];
  string local_1e8 [32];
  undefined1 local_1c8 [24];
  string local_1b0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [24];
  string local_168 [32];
  undefined1 local_148 [8];
  shared_ptr<Token> token;
  string local_130 [32];
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  string local_e8 [32];
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  string local_a0 [32];
  undefined1 local_80 [24];
  string local_68 [32];
  undefined1 local_48 [24];
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> parameters;
  bool error;
  Parser *this_local;
  
  parameters.super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::vector
            ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
             (local_48 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"Expected function keyword for function definition",
             (allocator<char> *)(local_80 + 0x17));
  type = (TokenType)this;
  expect((Parser *)local_48,type,(bool *)0x9,
         (string *)
         ((long)&parameters.
                 super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0x17));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Expected left paren following function definition",
             (allocator<char> *)(local_b8 + 0x17));
  expect((Parser *)local_80,type,(bool *)0x5,
         (string *)
         ((long)&parameters.
                 super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(local_b8 + 0x17));
  do {
    skipWhiteSpace(this);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_b8);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_b8);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_b8);
    if (TVar1 == EndOfFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_e8,"Expected a right paren to close parameter list of function definition",
                 (allocator<char> *)(local_100 + 0x17));
      expect((Parser *)local_c8,type,(bool *)0x6,
             (string *)
             ((long)&parameters.
                     super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_c8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0x17));
      std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>::optional
                (__return_storage_ptr__);
      local_100._16_4_ = 1;
      goto LAB_00110373;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_100);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_100);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_100);
    if (TVar1 == RightParen) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_130,"Expected a right paren to close parameter list of function definition",
                 (allocator<char> *)
                 ((long)&token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      expect((Parser *)local_110,type,(bool *)0x6,
             (string *)
             ((long)&parameters.
                     super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      break;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_168,"Expected identifier as parameter of function definition",
               (allocator<char> *)(local_180 + 0x17));
    expect((Parser *)local_148,type,(bool *)0x18,
           (string *)
           ((long)&parameters.
                   super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)(local_180 + 0x17));
    skipWhiteSpace(this);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_148);
    if (peVar3->tokenType == Identifier) {
      std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::push_back
                ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                 (local_48 + 0x10),(value_type *)local_148);
    }
    else {
      parameters.
      super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_180);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_180);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_180);
    if (TVar1 == RightParen) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1b0,"Expected a right paren to close parameter list of function definition",
                 (allocator<char> *)(local_1c8 + 0x17));
      expect((Parser *)local_190,type,(bool *)0x6,
             (string *)
             ((long)&parameters.
                     super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_190);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)(local_1c8 + 0x17));
      local_100._16_4_ = 3;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e8,"Expected a comma between function parameters in function definition",
                 (allocator<char> *)(local_200 + 0x17));
      expect((Parser *)local_1c8,type,(bool *)0x13,
             (string *)
             ((long)&parameters.
                     super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)(local_200 + 0x17));
      local_100._16_4_ = 0;
    }
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_148);
  } while (local_100._16_4_ == 0);
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,"Expected left curly bracket after to begin function body definition",
             (allocator<char> *)
             ((long)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expect((Parser *)local_200,type,(bool *)0x2,
         (string *)
         ((long)&parameters.
                 super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_200);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
          *)(local_250 + 0x10));
  do {
    skipWhiteSpace(this);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_250);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_250);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_250);
    if (TVar1 == EndOfFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_280,"Expected a right curly bracket to end function definition",
                 (allocator<char> *)(local_298 + 0x17));
      expect((Parser *)local_260,type,(bool *)0x3,
             (string *)
             ((long)&parameters.
                     super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_260);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)(local_298 + 0x17));
      std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>::optional
                (__return_storage_ptr__);
LAB_00110367:
      local_100._16_4_ = 1;
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 *)(local_250 + 0x10));
LAB_00110373:
      std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::~vector
                ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                 (local_48 + 0x10));
      return __return_storage_ptr__;
    }
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)local_298);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_298);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_298);
    if (TVar1 == RightCurly) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_2c8,"Expected a right curly bracket to end function definition",
                 (allocator<char> *)
                 &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
      expect((Parser *)local_2a8,type,(bool *)0x3,
             (string *)
             ((long)&parameters.
                     super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
      if ((parameters.
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::
        make_shared<FunctionDeclarationExpressionAstNode,std::vector<std::shared_ptr<Token>,std::allocator<std::shared_ptr<Token>>>&,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
                  (&local_300,
                   (vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                    *)(local_48 + 0x10));
        std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>::
        optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>,_true>
                  (__return_storage_ptr__,
                   (shared_ptr<FunctionDeclarationExpressionAstNode> *)&local_300);
        std::shared_ptr<FunctionDeclarationExpressionAstNode>::~shared_ptr
                  ((shared_ptr<FunctionDeclarationExpressionAstNode> *)&local_300);
      }
      else {
        std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>::optional
                  (__return_storage_ptr__);
      }
      goto LAB_00110367;
    }
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_2e8,this);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_2e8);
    if (bVar2) {
      __x = std::optional<std::shared_ptr<StatementAstNode>_>::value
                      ((optional<std::shared_ptr<StatementAstNode>_> *)local_2e8);
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)(local_250 + 0x10),__x);
    }
    else {
      parameters.
      super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    std::optional<std::shared_ptr<StatementAstNode>_>::~optional
              ((optional<std::shared_ptr<StatementAstNode>_> *)local_2e8);
  } while( true );
}

Assistant:

const std::optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>>
Parser::parseFunctionDeclarationExpression() noexcept {
  bool error = false;
  std::vector<std::shared_ptr<Token>> parameters;

  this->expect(TokenType::Function, error, "Expected function keyword for function definition");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected left paren following function definition");

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      break;
    }

    auto token = this->expect(TokenType::Identifier, error,
      "Expected identifier as parameter of function definition");

    this->skipWhiteSpace();

    if (token->tokenType != TokenType::Identifier) {
      error = true;

    } else {
      parameters.push_back(token);
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      this->expect(TokenType::RightParen, error,
        "Expected a right paren to close parameter list of function definition");
      break;
    }

    this->expect(TokenType::Comma, error,
      "Expected a comma between function parameters in function definition");
  }

  this->skipWhiteSpace();

  this->expect(TokenType::LeftCurly, error,
    "Expected left curly bracket after to begin function body definition");

  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end function definition");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end function definition");
      break;
    }

    auto statement = this->parseStatement();

    if (!statement) {
      error = true;

    } else {
      statements.push_back(statement.value());
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<FunctionDeclarationExpressionAstNode>(parameters, statements);
}